

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void lj_record_ins(jit_State *J)

{
  IROp1 *pIVar1;
  SnapEntry *pSVar2;
  byte bVar3;
  IROp *pc;
  GCproto *pt;
  GCproto *pGVar4;
  TValue *pTVar5;
  TRef *pTVar6;
  SnapShot *pSVar7;
  TValue TVar8;
  IRRef1 IVar9;
  ushort uVar10;
  BCLine BVar11;
  uint uVar12;
  int iVar13;
  TRef TVar14;
  uint uVar15;
  LoopEvent LVar16;
  ulong uVar17;
  IROp IVar18;
  MMS MVar19;
  ulong uVar20;
  IROp IVar21;
  BCIns *pc_00;
  ushort uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  TValue *o;
  IROp IVar28;
  TValue local_80;
  TValue local_78;
  TValue local_70 [4];
  uint local_50;
  uint local_4c;
  uint local_48;
  undefined4 local_3c;
  uint local_34;
  uint rbase;
  
  if (J->postproc != LJ_POST_NONE) {
    switch(J->postproc) {
    case LJ_POST_FIXCOMP:
      uVar24._0_2_ = J[-1].penalty[0x3f].val;
      uVar24._2_2_ = J[-1].penalty[0x3f].reason;
      rec_comp_fixup(J,*(BCIns **)&J[-1].penaltyslot,
                     **(BCIns **)&J[-1].penaltyslot & 1 ^ (uint)(0xfffffffd < uVar24));
    case LJ_POST_FIXGUARD:
    case LJ_POST_FIXGUARDSNAP:
      uVar12._0_2_ = J[-1].penalty[0x3f].val;
      uVar12._2_2_ = J[-1].penalty[0x3f].reason;
      if ((0xfffffffd < uVar12) &&
         (pIVar1 = &(J->fold).ins.field_1.o, *pIVar1 = *pIVar1 ^ 1,
         J->postproc == LJ_POST_FIXGUARDSNAP)) {
        uVar25 = (ulong)(J->cur).nsnap;
        pSVar7 = (J->cur).snap;
        pSVar2 = (J->cur).snapmap +
                 (((uint)pSVar7[uVar25 - 1].nent + pSVar7[uVar25 - 1].mapofs) - 1);
        *pSVar2 = *pSVar2 - 1;
      }
      lj_opt_fold(J);
    case LJ_POST_FIXBOOL:
      uVar15._0_2_ = J[-1].penalty[0x3f].val;
      uVar15._2_2_ = J[-1].penalty[0x3f].reason;
      if ((0xfffffffd < uVar15) && ((ulong)J->maxslot != 0)) {
        uVar25 = 0;
        do {
          if ((J->base[uVar25] == 0x2007ffd) && (*(int *)((long)J->L->base + uVar25 * 8 + 4) == -2))
          {
            J->base[uVar25] = 0x1007ffe;
            break;
          }
          uVar25 = uVar25 + 1;
        } while (J->maxslot != uVar25);
      }
      break;
    case LJ_POST_FIXCONST:
      if (J->maxslot != 0) {
        pTVar5 = J->L->base;
        uVar25 = 0;
        o = pTVar5;
        do {
          if ((J->base[uVar25] == 0x7fff) && (*(int *)((long)pTVar5 + uVar25 * 8 + 4) != -1)) {
            TVar14 = lj_record_constify(J,o);
            J->base[uVar25] = TVar14;
          }
          uVar25 = uVar25 + 1;
          o = o + 1;
        } while (uVar25 < J->maxslot);
      }
      break;
    case LJ_POST_FFRETRY:
      if (0x60 < (byte)*J->pc) {
        return;
      }
    }
    J->postproc = LJ_POST_NONE;
  }
  if (J->needsnap != '\0') {
    J->needsnap = '\0';
    if (J->pt != (GCproto *)0x0) {
      lj_snap_purge(J);
    }
    lj_snap_add(J);
    J->mergesnap = '\x01';
  }
  if (J->bcskip != '\0') {
    J->bcskip = J->bcskip + 0xff;
    return;
  }
  pc = J->pc;
  if ((J->framedepth == 0) && (J->bc_extent <= (uint)((int)pc - *(int *)&J->bc_min))) {
    lj_trace_err(J,LJ_TRERR_LLEAVE);
  }
  if ((J->prof_mode != 0) && (pt = J->pt, pt != (GCproto *)0x0)) {
    pGVar4 = J->prev_pt;
    J->prev_pt = pt;
    if (pGVar4 == (GCproto *)0x0 || pGVar4 == pt) {
      if (J->prof_mode == 0x6c) {
        BVar11 = lj_debug_line(pt,(BCPos)((ulong)((long)pc + (-0x40 - (long)pt)) >> 2));
        iVar13 = J->prev_line;
        J->prev_line = BVar11;
        if (iVar13 != BVar11) goto LAB_0014156b;
      }
    }
    else {
      J->prev_line = -1;
LAB_0014156b:
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      lj_snap_add(J);
    }
  }
  pTVar5 = J->L->base;
  IVar28 = *pc;
  IVar18 = IVar28 & 0xff;
  uVar24 = IVar28 >> 8 & 0xff;
  uVar20 = (ulong)uVar24;
  local_48 = 0;
  uVar10 = lj_bc_mode[IVar18];
  local_34 = uVar10 & 7;
  uVar25 = uVar20;
  if ((short)local_34 == 3) {
    local_70[0] = pTVar5[uVar20];
    uVar12 = J->base[uVar20];
    if (J->base[uVar20] == 0) {
      uVar12 = sload(J,uVar24);
    }
    local_48 = uVar12;
    uVar25 = (ulong)local_48;
  }
  uVar27 = (ulong)(IVar28 >> 0x18);
  uVar23 = (ulong)(IVar28 >> 0x10 & 0xff);
  if ((uVar10 >> 3 & 0xf) == 3) {
    local_80 = pTVar5[uVar27];
    local_50 = J->base[uVar27];
    if (local_50 == 0) {
      local_50 = sload(J,IVar28 >> 0x18);
    }
    uVar27 = (ulong)local_50;
  }
  else if ((uVar10 >> 3 & 0xf) == 0) {
    uVar27 = 0;
    uVar23 = (ulong)(IVar28 >> 0x10);
  }
  uVar24 = (uint)uVar23;
  switch(uVar10 >> 7 & 0xf) {
  case 3:
    local_78 = (TValue)*(TValue *)&pTVar5[uVar23].field_2;
    local_4c = J->base[uVar23];
    if (local_4c == 0) {
      local_4c = sload(J,uVar24);
    }
    break;
  default:
    goto switchD_001416b4_caseD_4;
  case 8:
    local_78.field_2.it = ~uVar24;
    local_4c = uVar24 * 0xffffff + 0x7fff;
    break;
  case 9:
    uVar17 = (ulong)(J->pt->k).ptr32;
    local_78 = (TValue)*(TValue *)&((TValue *)(uVar17 + uVar23 * 8))->field_2;
    local_4c = lj_ir_knumint(J,*(lua_Number *)(uVar17 + uVar23 * 8));
    break;
  case 10:
    local_78.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
         ((anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
         ((ulong)(J->pt->k).ptr32 + (long)(int)~uVar24 * 4))->i;
    local_78.field_2.it = 0xfffffffb;
    local_4c = lj_ir_kgc(J,(GCobj *)(ulong)local_78.u32.lo,IRT_STR);
  }
  uVar23 = (ulong)local_4c;
switchD_001416b4_caseD_4:
  TVar8 = local_80;
  uVar22 = (ushort)uVar23;
  uVar15 = (uint)uVar23;
  uVar12 = (uint)uVar27;
  uVar24 = (uint)(uVar23 >> 0x18);
  uVar26 = (ushort)uVar25;
  rbase = (uint)uVar25;
  switch(IVar28 & 0xff) {
  case IR_LT:
  case IR_GE:
  case IR_LE:
  case IR_GT:
    if (((rbase & 0x1f000000) == 0xa000000) || ((uVar15 & 0x1f000000) == 0xa000000)) {
      MVar19 = MM_le - ((IVar28 & IR_LE) == IR_LT);
LAB_00141946:
      rec_mm_comp_cdata(J,(RecordIndex *)&local_80.field_2,IVar18,MVar19);
      break;
    }
    uVar12 = (uint)(uVar25 >> 0x18);
    if (((-1 < (short)(uVar22 | uVar26)) &&
        (((rbase & 0x1f000000) == 0x4000000 || ((uVar12 & 0x1e) - 0xe < 6)))) &&
       (((uVar15 & 0x1f000000) == 0x4000000 || ((uVar24 & 0x1e) - 0xe < 6)))) break;
    uVar12 = uVar12 & 0x1f;
    if (uVar12 - 0xf < 5) {
      uVar12 = 0x13;
    }
    uVar24 = uVar24 & 0x1f;
    if (uVar24 - 0xf < 5) {
      uVar24 = 0x13;
    }
    if (uVar12 != uVar24) {
      if ((uVar12 == 0x13) && (uVar24 == 0xe)) {
        (J->fold).ins.field_0.op1 = uVar26;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
        TVar14 = lj_opt_fold(J);
        uVar25 = (ulong)TVar14;
      }
      else {
        if ((uVar12 != 0xe) || (uVar24 != 0x13)) {
          if ((1 < uVar12 - 1) || (1 < uVar24 - 1)) break;
          goto LAB_00142318;
        }
        (J->fold).ins.field_0.op1 = uVar22;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
        TVar14 = lj_opt_fold(J);
        uVar23 = (ulong)TVar14;
      }
      uVar12 = 0xe;
    }
LAB_00142318:
    rec_comp_prep(J);
    if (uVar12 == 4) {
      iVar13 = lj_ir_strcmp((GCstr *)(local_70[0].u64 & 0xffffffff),
                            (GCstr *)(local_78.u64 & 0xffffffff),IVar18);
      TVar14 = lj_ir_call(J,IRCALL_lj_str_cmp,uVar25,uVar23);
      uVar25 = (ulong)TVar14;
      TVar14 = lj_ir_kint(J,0);
      uVar23 = (ulong)TVar14;
LAB_001423d9:
      IVar21 = iVar13 == 0 ^ IVar18;
      uVar10 = 0x93;
    }
    else {
      if (uVar12 == 0x13) {
        iVar13 = lj_ir_numcmp(local_70[0].n,local_78.n,IVar18);
        goto LAB_001423d9;
      }
      if (uVar12 != 0xe) {
        rec_mm_comp(J,(RecordIndex *)&local_80.field_2,IVar18);
        break;
      }
      IVar18 = IVar28 * 4 & IR_ULT ^ IVar18;
      iVar13 = lj_ir_numcmp(local_70[0].n,local_78.n,IVar18);
      IVar21 = IVar18 ^ IR_UGE;
      if (iVar13 != 0) {
        IVar21 = IVar18;
      }
      uVar10 = 0x8e;
    }
    (J->fold).ins.field_0.ot = (ushort)(IVar21 << 8) | uVar10;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar25;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar23;
    lj_opt_fold(J);
    pc_00 = J->pc;
    IVar28 = IVar28 ^ IVar21;
    goto LAB_00142415;
  case IR_ULT:
  case IR_UGE:
  case IR_ULE:
  case IR_UGT:
  case IR_EQ:
  case IR_NE:
  case IR_ABC:
  case IR_RETF:
    uVar24 = rbase & 0x1f000000;
    if ((uVar24 == 0xa000000) || ((uVar15 & 0x1f000000) == 0xa000000)) {
      MVar19 = MM_eq;
      goto LAB_00141946;
    }
    if (((-1 < (short)(uVar22 | uVar26)) && (uVar24 != 0xc000000)) && (uVar24 != 0xb000000)) break;
    rec_comp_prep(J);
    iVar13 = lj_record_objcmp(J,rbase,uVar15,local_70,&local_78);
    if ((iVar13 != 2) && ((uVar24 == 0xb000000 || (uVar24 == 0xc000000)))) {
      if (iVar13 == 1) {
        rec_mm_equal(J,(RecordIndex *)&local_80.field_2,IVar18);
      }
      break;
    }
    pc_00 = J->pc;
    IVar28 = (IROp)(byte)(iVar13 != 0 ^ (byte)IVar28);
LAB_00142415:
    rec_comp_fixup(J,pc_00,IVar28 & IR_GE);
    break;
  case IR_NOP:
  case IR_BASE:
    if ((((uVar23 & 0x1e000000) == 0 ^ (byte)IVar28) & 1) != 0) {
      uVar23 = 0;
    }
  case IR_PVAL:
  case IR_GCSTEP:
    uVar15 = (uint)*(byte *)((long)pc + 5);
    if ((uint)*(byte *)((long)pc + 5) < J->maxslot) {
LAB_00141a1e:
      J->maxslot = uVar15;
    }
    break;
  case IR_HIOP:
  case IR_LOOP:
    if (uVar15 == 5) {
      uVar24 = lj_ir_tostr(J,rbase);
LAB_00142278:
      uVar25 = (ulong)uVar24;
    }
    else if (uVar15 == 0xf) {
      uVar24 = lj_ir_tonum(J,rbase);
      goto LAB_00142278;
    }
    J->base[uVar20] = (TRef)uVar25;
    break;
  case IR_USE:
    if (J->maxslot < rbase) {
      J->base[rbase - 1] = 0;
    }
    break;
  case IR_PHI:
    uVar20 = uVar23 & 0x1e000000;
    uVar23 = 0x1007ffe;
    if (uVar20 == 0) {
      uVar23 = 0x2007ffd;
    }
    goto switchD_0014176b_caseD_27;
  case IR_RENAME:
    if ((uVar15 & 0x1f000000) == 0x4000000 || (uVar24 & 0x1e) - 0xe < 6) {
      uVar24 = lj_opt_narrow_unm(J,uVar15,&local_78);
      goto LAB_00141af3;
    }
    local_80.u64 = local_78.u64;
    MVar19 = MM_unm;
    local_50 = uVar15;
LAB_001422a9:
    rec_mm_arith(J,(RecordIndex *)&local_80.field_2,MVar19);
    uVar23 = 0;
    goto switchD_0014176b_caseD_27;
  case IR_PROF:
    if ((uVar15 & 0x1f000000) == 0xb000000) {
      uVar24 = lj_ir_call(J,IRCALL_lj_tab_len,uVar23);
      goto LAB_00141af3;
    }
    if ((uVar15 & 0x1f000000) == 0x4000000) {
      (J->fold).ins.field_0.op1 = uVar22;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
      uVar24 = lj_opt_fold(J);
      goto LAB_00141f88;
    }
    rec_mm_len(J,uVar15,&local_78);
    goto LAB_00141aac;
  case IR_KPRI:
  case IR_KINT:
  case IR_KGC:
  case IR_KPTR:
  case IR_BSWAP:
  case IR_BAND:
  case IR_BOR:
  case IR_BXOR:
    uVar20 = uVar23;
    uVar23 = uVar27;
    goto LAB_00141851;
  case IR_KKPTR:
  case IR_BSHL:
    uVar23 = uVar27;
    uVar12 = uVar15;
LAB_00141a2f:
    if (((((uint)uVar23 & 0x1f000000) != 0x4000000) && (5 < ((uint)(uVar23 >> 0x18) & 0x1e) - 0xe))
       || ((uVar12 & 0x1f000000) != 0x4000000 && 5 < (uVar12 >> 0x18 & 0x1e) - 0xe)) {
      MVar19 = MM_mod;
      goto LAB_00141aa7;
    }
    uVar24 = lj_opt_narrow_mod(J,(uint)uVar23,uVar12,&local_80,&local_78);
    goto LAB_00141f88;
  case IR_KNULL:
  case IR_KNUM:
  case IR_KINT64:
  case IR_KSLOT:
  case IR_BNOT:
    local_70[0] = local_80;
    local_80.u64 = local_78.u64;
    local_78 = TVar8;
    uVar20 = uVar27;
    local_50 = uVar15;
    local_4c = uVar12;
    if (IVar18 == IR_BNOT) goto LAB_00141a2f;
LAB_00141851:
    if (((((uint)uVar23 & 0x1f000000) == 0x4000000) || (((uint)(uVar23 >> 0x18) & 0x1e) - 0xe < 6))
       && (((TRef)uVar20 & 0x1f000000) == 0x4000000 || ((uint)(uVar20 >> 0x18) & 0x1e) - 0xe < 6)) {
      uVar24 = lj_opt_narrow_arith(J,(uint)uVar23,(TRef)uVar20,&local_80,&local_78,
                                   (uVar10 >> 0xb) + IR_BNOT);
LAB_00141f88:
      uVar23 = (ulong)uVar24;
    }
    else {
      MVar19 = (MMS)(uVar10 >> 0xb);
LAB_00141aa7:
      rec_mm_arith(J,(RecordIndex *)&local_80.field_2,MVar19);
LAB_00141aac:
      uVar23 = 0;
    }
    break;
  case IR_BSHR:
    if (((uVar12 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uVar27 >> 0x18) & 0x1e) - 0xe) ||
       ((uVar15 & 0x1f000000) != 0x4000000 && 5 < (uVar24 & 0x1e) - 0xe)) {
      MVar19 = MM_pow;
      goto LAB_001422a9;
    }
    uVar24 = lj_opt_narrow_arith(J,uVar12,uVar15,&local_80,&local_78,IR_POW);
    goto LAB_00141af3;
  case IR_BSAR:
    TVar14 = rec_cat(J,uVar12,uVar15);
    uVar23 = (ulong)TVar14;
    if (0xfffffeff < TVar14) {
      lj_err_throw(J->L,-TVar14);
    }
    break;
  case IR_BROL:
  case IR_SUB:
  case IR_MUL:
  case IR_CALLA:
    goto switchD_0014176b_caseD_27;
  case IR_BROR:
    uVar24 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((ulong)(J->pt->k).ptr32 + ~uVar23 * 4),IRT_CDATA)
    ;
    goto LAB_00141af3;
  case IR_ADD:
    uVar24 = lj_ir_kint(J,(int)(short)uVar22);
    goto LAB_00141af3;
  case IR_DIV:
    if (rbase <= uVar15) {
      pTVar6 = J->base;
      uVar20 = uVar25;
      do {
        uVar24 = (int)uVar20 + 1;
        uVar25 = (ulong)uVar24;
        pTVar6[uVar20] = 0x7fff;
        uVar20 = uVar25;
      } while (uVar24 <= uVar15);
    }
    if (uVar15 < J->maxslot) break;
    uVar15 = uVar15 + 1;
    goto LAB_00141a1e;
  case IR_MOD:
    uVar24 = rec_upvalue(J,uVar15,0);
    goto LAB_00141af3;
  case IR_POW:
  case IR_NEG:
  case IR_ABS:
  case IR_LDEXP:
    rec_upvalue(J,rbase,uVar15);
    break;
  case IR_MIN:
  case IR_MAX:
  case IR_SLOAD:
  case IR_ASTORE:
switchD_0014176b_caseD_32:
    (J->errinfo).n = (double)IVar18;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  case IR_FPMATH:
    IVar9 = 0x801;
    if ((uVar15 & 0x7ff) != 0x7ff) {
      IVar9 = (IRRef1)(uVar15 & 0x7ff);
    }
    (J->fold).ins.field_0.ot = 0x4f8b;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)(uVar15 >> 0xb);
    goto LAB_00141e3b;
  case IR_ADDOV:
    TVar14 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((ulong)(J->pt->k).ptr32 + ~uVar23 * 4),IRT_TAB);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x508b0000;
LAB_00141e3b:
    uVar24 = lj_opt_fold(J);
    goto LAB_00141af3;
  case IR_SUBOV:
  case IR_MULOV:
    local_80.field_2.it = 0xfffffff4;
    local_80.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(J->fn->c).env.gcptr32
    ;
    TVar14 = getcurrf(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x440b0001;
    local_50 = lj_opt_fold(J);
    local_3c = 100;
    goto LAB_00141aee;
  case IR_AREF:
  case IR_HREFK:
  case IR_UREFO:
  case IR_UREFC:
    goto switchD_0014176b_caseD_38;
  case IR_HREF:
  case IR_FREF:
    local_78.n = (lua_Number)(int)uVar15;
    local_4c = lj_ir_kint(J,uVar15);
    goto switchD_0014176b_caseD_38;
  case IR_NEWREF:
  case IR_LREF:
    local_3c = 0;
LAB_00141aee:
    uVar24 = lj_record_idx(J,(RecordIndex *)&local_80.field_2);
LAB_00141af3:
    uVar23 = (ulong)uVar24;
    goto switchD_0014176b_caseD_27;
  case IR_STRREF:
    rec_tsetm(J,rbase,(BCReg)((ulong)((long)J->L->top - (long)J->L->base) >> 3),local_78._0_4_);
    goto LAB_00142052;
  case IR_ALOAD:
    uVar23 = (ulong)((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - rbase);
    goto LAB_00142010;
  case IR_HLOAD:
    goto LAB_00142010;
  case IR_ULOAD:
    uVar23 = (ulong)((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - rbase);
    goto LAB_00142062;
  case IR_FLOAD:
LAB_00142062:
    lj_record_tailcall(J,rbase,uVar23 - 1);
    break;
  case IR_XLOAD:
    TVar14 = J->base[rbase - 3];
    if (TVar14 == 0) {
      TVar14 = sload(J,rbase - 3);
    }
    pTVar6 = J->base;
    pTVar6[uVar25] = TVar14;
    TVar14 = pTVar6[rbase - 2];
    if (TVar14 == 0) {
      TVar14 = sload(J,rbase - 2);
    }
    pTVar6 = J->base;
    pTVar6[rbase + 1] = TVar14;
    TVar14 = pTVar6[rbase - 1];
    if (TVar14 == 0) {
      TVar14 = sload(J,rbase - 1);
    }
    J->base[rbase + 2] = TVar14;
    pTVar5 = J->L->base;
    pTVar5[uVar25] = pTVar5[uVar25 - 3];
    TVar8 = (pTVar5 + (uVar25 - 2))[1];
    pTVar5[uVar25 + 1] = pTVar5[uVar25 - 2];
    (pTVar5 + uVar25 + 1)[1] = TVar8;
LAB_00142010:
    lj_record_call(J,rbase,uVar23 - 1);
    break;
  case IR_VLOAD:
    rec_varg(J,rbase,uVar27 - 1);
    break;
  case IR_HSTORE:
    uVar23 = (ulong)(((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - rbase) + 1);
    goto LAB_00141ba3;
  case IR_USTORE:
  case IR_FSTORE:
  case IR_XSTORE:
LAB_00141ba3:
    if (J->prof_mode == 0x66) {
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      J->prev_pt = (GCproto *)0x0;
      lj_snap_add(J);
    }
    lj_record_ret(J,rbase,uVar23 - 1);
    break;
  case IR_SNEW:
    LVar16 = rec_for(J,pc,0);
    if (LVar16 != LOOPEV_LEAVE) {
      J->loopref = (J->cur).nins;
    }
    break;
  case IR_XSNEW:
    LVar16 = rec_for(J,pc,0);
    if (LVar16 == LOOPEV_LEAVE) break;
    lj_record_stop(J,LJ_TRLINK_ROOT,(uint)*(ushort *)((long)pc + uVar23 * 4 + -0x1fffe));
    goto switchD_0014176b_caseD_27;
  case IR_TNEW:
    LVar16 = rec_for(J,pc + (uVar23 - 0x8000),1);
    goto LAB_00141f3a;
  case IR_TDUP:
  case IR_BUFHDR:
  case IR_TBAR:
  case IR_TOBIT:
  case IR_CALLN:
    lj_trace_err(J,LJ_TRERR_BLACKL);
  case IR_CNEW:
    LVar16 = rec_for(J,pc + ((ulong)*(ushort *)((ulong)J->trace[uVar23].gcptr32 + 0x3a) - 0x8000),1)
    ;
    goto LAB_00142159;
  case IR_CNEWI:
    LVar16 = rec_iterl(J,*pc);
LAB_00141f3a:
    rec_loop_interp(J,pc,LVar16);
    goto switchD_0014176b_caseD_27;
  case IR_BUFPUT:
    LVar16 = rec_iterl(J,*(BCIns *)((ulong)J->trace[uVar23].gcptr32 + 0x38));
LAB_00142159:
    rec_loop_jit(J,uVar15,LVar16);
    goto switchD_0014176b_caseD_27;
  case IR_BUFSTR:
    if (rbase < J->maxslot) {
      J->maxslot = rbase;
    }
    J->pc = J->pc + 1;
    rec_loop_interp(J,pc,LOOPEV_ENTER);
    break;
  case IR_OBAR:
    bVar3 = *(byte *)((ulong)J->trace[uVar23].gcptr32 + 0x38);
    if (rbase < J->maxslot) {
      J->maxslot = rbase;
    }
    J->pc = J->pc + (bVar3 - 0x4d < 0xfffffffc);
    rec_loop_jit(J,uVar15,LOOPEV_ENTER);
    break;
  case IR_XBAR:
    if (J->maxslot <= rbase) break;
LAB_00142052:
    J->maxslot = rbase;
    break;
  case IR_CONV:
    goto LAB_00141c67;
  case IR_TOSTR:
    rec_func_jit(J,uVar15);
    goto switchD_0014176b_caseD_27;
  case IR_STRTO:
    rec_func_vararg(J);
LAB_00141c67:
    rec_func_setup(J);
    check_call_unroll(J,0);
    goto switchD_0014176b_caseD_27;
  case IR_CALLL:
  case IR_CALLS:
    goto switchD_0014176b_caseD_5f;
  default:
    if (IVar18 < IR_CALLXS) goto switchD_0014176b_caseD_32;
    goto switchD_0014176b_caseD_5f;
  }
LAB_001421f5:
  if (((short)local_34 == 1) && ((TRef)uVar23 != 0)) {
    J->base[uVar25] = (TRef)uVar23;
    if (J->maxslot <= (uint)uVar25) {
      J->maxslot = (uint)uVar25 + 1;
    }
  }
  if (((J->cur).nins <= J->param[1] + 0x8001U) && (0x8000U - J->param[2] <= (J->cur).nk)) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_TRACEOV);
switchD_0014176b_caseD_5f:
  lj_ffrecord_func(J);
switchD_0014176b_caseD_27:
  goto LAB_001421f5;
switchD_0014176b_caseD_38:
  local_3c = 100;
  goto LAB_00141aee;
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = lj_ir_call(J, IRCALL_lj_tab_len, rc);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv, IR_POW);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    if (rc >= 0xffffff00)
      lj_err_throw(J->L, -(int32_t)rc);  /* Propagate errors. */
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    J->maxslot = ra;  /* The table slot at ra-1 is the highest used slot. */
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins))));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_ITERN:
  case BC_ISNEXT:
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}